

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

bilingual_str * common::ResolveErrMsg(string *optname,string *strBind)

{
  long lVar1;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_ffffffffffffff68;
  ConstevalStringLiteral in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  bilingual_str *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::_(in_stack_ffffffffffffffb8);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bilingual_str::~bilingual_str(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str ResolveErrMsg(const std::string& optname, const std::string& strBind)
{
    return strprintf(_("Cannot resolve -%s address: '%s'"), optname, strBind);
}